

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pvtable.cc
# Opt level: O2

Move __thiscall search::PVTable::getMove(PVTable *this,Board *pos)

{
  const_iterator cVar1;
  Move MVar2;
  uint64_t hash;
  uint64_t local_8;
  
  local_8 = pos->hashKey;
  cVar1 = std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_board::Move>,_std::allocator<std::pair<const_unsigned_long,_board::Move>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_board::Move>,_std::allocator<std::pair<const_unsigned_long,_board::Move>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)this,&local_8);
  if (cVar1.super__Node_iterator_base<std::pair<const_unsigned_long,_board::Move>,_false>._M_cur ==
      (__node_type *)0x0) {
    MVar2.value = 0;
    MVar2.score = 0;
  }
  else {
    MVar2 = *(Move *)((long)cVar1.
                            super__Node_iterator_base<std::pair<const_unsigned_long,_board::Move>,_false>
                            ._M_cur + 0x10);
  }
  return MVar2;
}

Assistant:

board::Move search::PVTable::getMove(board::Board& pos) const
{
    uint64_t hash = pos.getHashKey();
    auto element = map.find(hash);
    board::Move move;
    if (element != map.end()) {
        move = element->second;
    }
    return move;
}